

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorFactory.cpp
# Opt level: O2

void ApprovalTests::EmptyFileCreatorFactory::defaultCreator(string *fullFilePath)

{
  size_t in_RCX;
  void *__buf;
  StringWriter s;
  allocator local_b2;
  allocator local_b1;
  string local_b0 [32];
  string local_90;
  string local_70;
  StringWriter local_50;
  
  ::std::__cxx11::string::string((string *)&local_70,"",&local_b1);
  ::std::__cxx11::string::string((string *)&local_90,"",&local_b2);
  StringWriter::StringWriter(&local_50,&local_70,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string(local_b0,(string *)fullFilePath);
  StringWriter::write(&local_50,(int)local_b0,__buf,in_RCX);
  ::std::__cxx11::string::~string(local_b0);
  StringWriter::~StringWriter(&local_50);
  return;
}

Assistant:

void EmptyFileCreatorFactory::defaultCreator(std::string fullFilePath)
    {
        StringWriter s("", "");
        s.write(fullFilePath);
    }